

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picosha2.h
# Opt level: O1

void __thiscall picosha2::hash256_one_by_one::finish(hash256_one_by_one *this)

{
  pointer __src;
  ulong __n;
  byte_t temp [64];
  uchar local_58 [56];
  byte_t abStack_20 [8];
  
  local_58[0x30] = '\0';
  local_58[0x31] = '\0';
  local_58[0x32] = '\0';
  local_58[0x33] = '\0';
  local_58[0x34] = '\0';
  local_58[0x35] = '\0';
  local_58[0x36] = '\0';
  local_58[0x37] = '\0';
  abStack_20[0] = '\0';
  abStack_20[1] = '\0';
  abStack_20[2] = '\0';
  abStack_20[3] = '\0';
  abStack_20[4] = '\0';
  abStack_20[5] = '\0';
  abStack_20[6] = '\0';
  abStack_20[7] = '\0';
  local_58[0x20] = '\0';
  local_58[0x21] = '\0';
  local_58[0x22] = '\0';
  local_58[0x23] = '\0';
  local_58[0x24] = '\0';
  local_58[0x25] = '\0';
  local_58[0x26] = '\0';
  local_58[0x27] = '\0';
  local_58[0x28] = '\0';
  local_58[0x29] = '\0';
  local_58[0x2a] = '\0';
  local_58[0x2b] = '\0';
  local_58[0x2c] = '\0';
  local_58[0x2d] = '\0';
  local_58[0x2e] = '\0';
  local_58[0x2f] = '\0';
  local_58[0x10] = '\0';
  local_58[0x11] = '\0';
  local_58[0x12] = '\0';
  local_58[0x13] = '\0';
  local_58[0x14] = '\0';
  local_58[0x15] = '\0';
  local_58[0x16] = '\0';
  local_58[0x17] = '\0';
  local_58[0x18] = '\0';
  local_58[0x19] = '\0';
  local_58[0x1a] = '\0';
  local_58[0x1b] = '\0';
  local_58[0x1c] = '\0';
  local_58[0x1d] = '\0';
  local_58[0x1e] = '\0';
  local_58[0x1f] = '\0';
  local_58[0] = '\0';
  local_58[1] = '\0';
  local_58[2] = '\0';
  local_58[3] = '\0';
  local_58[4] = '\0';
  local_58[5] = '\0';
  local_58[6] = '\0';
  local_58[7] = '\0';
  local_58[8] = '\0';
  local_58[9] = '\0';
  local_58[10] = '\0';
  local_58[0xb] = '\0';
  local_58[0xc] = '\0';
  local_58[0xd] = '\0';
  local_58[0xe] = '\0';
  local_58[0xf] = '\0';
  __src = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
  __n = (long)(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish - (long)__src;
  if (__n != 0) {
    memmove(local_58,__src,__n);
  }
  local_58[__n] = 0x80;
  if (__n < 0x38) {
    if (__n != 0x3b) {
      memset(local_58 + __n + 1,0,0x3b - __n);
    }
  }
  else {
    if (__n != 0x3f) {
      memset(local_58 + __n + 1,0,0x3f - __n);
    }
    detail::hash256_block<unsigned_long*,unsigned_char*>(this->h_,local_58,&stack0xffffffffffffffe8)
    ;
    local_58[0x30] = '\0';
    local_58[0x31] = '\0';
    local_58[0x32] = '\0';
    local_58[0x33] = '\0';
    local_58[0x34] = '\0';
    local_58[0x35] = '\0';
    local_58[0x36] = '\0';
    local_58[0x37] = '\0';
    abStack_20[0] = '\0';
    abStack_20[1] = '\0';
    abStack_20[2] = '\0';
    abStack_20[3] = '\0';
    local_58[0x20] = '\0';
    local_58[0x21] = '\0';
    local_58[0x22] = '\0';
    local_58[0x23] = '\0';
    local_58[0x24] = '\0';
    local_58[0x25] = '\0';
    local_58[0x26] = '\0';
    local_58[0x27] = '\0';
    local_58[0x28] = '\0';
    local_58[0x29] = '\0';
    local_58[0x2a] = '\0';
    local_58[0x2b] = '\0';
    local_58[0x2c] = '\0';
    local_58[0x2d] = '\0';
    local_58[0x2e] = '\0';
    local_58[0x2f] = '\0';
    local_58[0x10] = '\0';
    local_58[0x11] = '\0';
    local_58[0x12] = '\0';
    local_58[0x13] = '\0';
    local_58[0x14] = '\0';
    local_58[0x15] = '\0';
    local_58[0x16] = '\0';
    local_58[0x17] = '\0';
    local_58[0x18] = '\0';
    local_58[0x19] = '\0';
    local_58[0x1a] = '\0';
    local_58[0x1b] = '\0';
    local_58[0x1c] = '\0';
    local_58[0x1d] = '\0';
    local_58[0x1e] = '\0';
    local_58[0x1f] = '\0';
    local_58[0] = '\0';
    local_58[1] = '\0';
    local_58[2] = '\0';
    local_58[3] = '\0';
    local_58[4] = '\0';
    local_58[5] = '\0';
    local_58[6] = '\0';
    local_58[7] = '\0';
    local_58[8] = '\0';
    local_58[9] = '\0';
    local_58[10] = '\0';
    local_58[0xb] = '\0';
    local_58[0xc] = '\0';
    local_58[0xd] = '\0';
    local_58[0xe] = '\0';
    local_58[0xf] = '\0';
  }
  write_data_bit_length(this,abStack_20);
  detail::hash256_block<unsigned_long*,unsigned_char*>(this->h_,local_58,&stack0xffffffffffffffe8);
  return;
}

Assistant:

void finish() {
        byte_t temp[64];
        std::fill(temp, temp + 64, 0);
        std::size_t remains = buffer_.size();
        std::copy(buffer_.begin(), buffer_.end(), temp);
        temp[remains] = 0x80;

        if (remains > 55) {
            std::fill(temp + remains + 1, temp + 64, 0);
            detail::hash256_block(h_, temp, temp + 64);
            std::fill(temp, temp + 64 - 4, 0);
        } else {
            std::fill(temp + remains + 1, temp + 64 - 4, 0);
        }

        write_data_bit_length(&(temp[56]));
        detail::hash256_block(h_, temp, temp + 64);
    }